

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O1

bool is_singularJacobian(VectorXd *x)

{
  long lVar1;
  double *pdVar2;
  float fVar3;
  float fVar4;
  
  lVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((0 < lVar1) && (lVar1 != 1)) {
    pdVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    fVar3 = (float)*pdVar2;
    fVar4 = (float)pdVar2[1];
    return ABS(fVar3 * fVar3 + fVar4 * fVar4) < 0.0001;
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                ,0xad,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

bool is_singularJacobian(const VectorXd &x) {
  float epsilon = 0.0001;
  float px = x(0);
  float py = x(1);
  return fabs(px*px + py*py) < epsilon;
}